

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

int NeedsFilter2_C(uint8_t *p,int step,int t,int it)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)step;
  uVar4 = (ulong)p[lVar3 * -2];
  uVar2 = (ulong)p[lVar3];
  uVar1 = 0;
  if (((((int)((uint)abs0[(uVar4 - uVar2) + 0xff] +
              (uint)abs0[((ulong)p[-lVar3] - (ulong)*p) + 0xff] * 4) <= t) &&
       ((int)(uint)abs0[((ulong)p[lVar3 * -4] - (ulong)p[lVar3 * -3]) + 0xff] <= it)) &&
      ((uint)abs0[(p[lVar3 * -3] - uVar4) + 0xff] <= (uint)it)) &&
     ((((uint)abs0[(uVar4 - p[-lVar3]) + 0xff] <= (uint)it &&
       ((uint)abs0[((ulong)p[lVar3 * 3] - (ulong)p[lVar3 * 2]) + 0xff] <= (uint)it)) &&
      ((uint)abs0[(p[lVar3 * 2] - uVar2) + 0xff] <= (uint)it)))) {
    uVar1 = (uint)((uint)abs0[(uVar2 - *p) + 0xff] <= (uint)it);
  }
  return uVar1;
}

Assistant:

static WEBP_INLINE int NeedsFilter2_C(const uint8_t* p,
                                      int step, int t, int it) {
  const int p3 = p[-4 * step], p2 = p[-3 * step], p1 = p[-2 * step];
  const int p0 = p[-step], q0 = p[0];
  const int q1 = p[step], q2 = p[2 * step], q3 = p[3 * step];
  if ((4 * VP8kabs0[p0 - q0] + VP8kabs0[p1 - q1]) > t) return 0;
  return VP8kabs0[p3 - p2] <= it && VP8kabs0[p2 - p1] <= it &&
         VP8kabs0[p1 - p0] <= it && VP8kabs0[q3 - q2] <= it &&
         VP8kabs0[q2 - q1] <= it && VP8kabs0[q1 - q0] <= it;
}